

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_ManSatSolveMiter_rec(Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Cec_ManSat_t *pSat_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                      ,0x3dd,
                      "void Cec_ManSatSolveMiter_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      Cec_ManSatSolveMiter_rec(pSat,p,pGVar3);
      pGVar3 = Gia_ObjFanin1(pObj);
      Cec_ManSatSolveMiter_rec(pSat,p,pGVar3);
    }
    else {
      pSat->nCexLits = pSat->nCexLits + 1;
      p_00 = pSat->vCex;
      iVar1 = Gia_ObjCioId(pObj);
      iVar2 = Cec_ObjSatVarValue(pSat,pObj);
      iVar1 = Abc_Var2Lit(iVar1,(uint)((iVar2 != 0 ^ 0xffU) & 1));
      Vec_IntPush(p_00,iVar1);
    }
  }
  return;
}

Assistant:

void Cec_ManSatSolveMiter_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pSat->nCexLits++;
        Vec_IntPush( pSat->vCex, Abc_Var2Lit( Gia_ObjCioId(pObj), !Cec_ObjSatVarValue(pSat, pObj) ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManSatSolveMiter_rec( pSat, p, Gia_ObjFanin0(pObj) );
    Cec_ManSatSolveMiter_rec( pSat, p, Gia_ObjFanin1(pObj) );
}